

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

CURLcode mqtt_subscribe(Curl_easy *data)

{
  uint *puVar1;
  connectdata *pcVar2;
  bool bVar3;
  CURLcode CVar4;
  ulong uVar5;
  char *buf;
  ulong uVar6;
  size_t len;
  ulong uVar7;
  size_t __n;
  size_t topiclen;
  char encodedsize [4];
  char *topic;
  char local_48;
  char cStack_47;
  undefined6 uStack_46;
  byte local_3c [4];
  char *local_38;
  
  local_38 = (char *)0x0;
  pcVar2 = data->conn;
  CVar4 = mqtt_get_topic(data,&local_38,(size_t *)&local_48);
  if (CVar4 == CURLE_OK) {
    puVar1 = &(pcVar2->proto).mqtt.packetid;
    *puVar1 = *puVar1 + 1;
    __n = 0;
    uVar5 = CONCAT62(uStack_46,CONCAT11(cStack_47,local_48)) + 5;
    uVar6 = uVar5;
    uVar7 = __n;
    if (uVar5 != 0) {
      do {
        local_3c[uVar7] = (0x7f < uVar6) << 7 | (byte)uVar6 & 0x7f;
        __n = uVar7 + 1;
        if (2 < uVar7) break;
        bVar3 = 0x7f < uVar6;
        uVar6 = uVar6 >> 7;
        uVar7 = __n;
      } while (bVar3);
    }
    len = __n + uVar5 + 1;
    buf = (char *)(*Curl_cmalloc)(len);
    if (buf != (char *)0x0) {
      *buf = -0x7e;
      memcpy(buf + 1,local_3c,__n);
      buf[__n + 1] = *(char *)((long)&pcVar2->proto + 9);
      buf[__n + 2] = *(char *)((long)&pcVar2->proto + 8);
      buf[__n + 3] = cStack_47;
      buf[__n + 4] = local_48;
      memcpy(buf + __n + 5,local_38,CONCAT62(uStack_46,CONCAT11(cStack_47,local_48)));
      buf[CONCAT62(uStack_46,CONCAT11(cStack_47,local_48)) + 5 + __n] = '\0';
      CVar4 = mqtt_send(data,buf,len);
      goto LAB_0014458a;
    }
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  buf = (char *)0x0;
LAB_0014458a:
  (*Curl_cfree)(local_38);
  (*Curl_cfree)(buf);
  return CVar4;
}

Assistant:

static CURLcode mqtt_subscribe(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  char *topic = NULL;
  size_t topiclen;
  unsigned char *packet = NULL;
  size_t packetlen;
  char encodedsize[4];
  size_t n;
  struct connectdata *conn = data->conn;

  result = mqtt_get_topic(data, &topic, &topiclen);
  if(result)
    goto fail;

  conn->proto.mqtt.packetid++;

  packetlen = topiclen + 5; /* packetid + topic (has a two byte length field)
                               + 2 bytes topic length + QoS byte */
  n = mqtt_encode_len((char *)encodedsize, packetlen);
  packetlen += n + 1; /* add one for the control packet type byte */

  packet = malloc(packetlen);
  if(!packet) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  packet[0] = MQTT_MSG_SUBSCRIBE;
  memcpy(&packet[1], encodedsize, n);
  packet[1 + n] = (conn->proto.mqtt.packetid >> 8) & 0xff;
  packet[2 + n] = conn->proto.mqtt.packetid & 0xff;
  packet[3 + n] = (topiclen >> 8) & 0xff;
  packet[4 + n ] = topiclen & 0xff;
  memcpy(&packet[5 + n], topic, topiclen);
  packet[5 + n + topiclen] = 0; /* QoS zero */

  result = mqtt_send(data, (char *)packet, packetlen);

fail:
  free(topic);
  free(packet);
  return result;
}